

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::Pop
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *this,iterator it)

{
  pointer *ppSVar1;
  pointer *ppuVar2;
  pointer pSVar3;
  pointer pSVar4;
  iterator iVar5;
  PositionType PVar6;
  PositionType PVar7;
  iterator local_28;
  
  PVar6 = it.Position;
  local_28.Tree = it.Tree;
  pSVar3 = (this->Data).
           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (this->Data).
           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.Position = PVar6;
  if (pSVar3 == pSVar4) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x92,
                  "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Pop(iterator) [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  PVar7 = (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (PVar7 == ((long)pSVar4 - (long)pSVar3) / 0xc0) {
    iterator::operator++(&local_28);
    if (PVar7 == PVar6) {
      ppSVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      ppuVar2 = &(this->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    iVar5.Position = local_28.Position;
    iVar5.Tree = local_28.Tree;
    return iVar5;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0x93,
                "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Pop(iterator) [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

iterator Pop(iterator it)
  {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast) {
      this->Data.pop_back();
      this->UpPositions.pop_back();
    }
    return it;
  }